

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<long,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  ArgMinMaxState<long,_double> *source_00;
  ArgMinMaxState<long,_double> *in_RCX;
  idx_t i;
  ArgMinMaxState<long,_double> **tdata;
  ArgMinMaxState<long,_double> **sdata;
  ArgMinMaxState<long,_double> *target_00;
  
  FlatVector::GetData<duckdb::ArgMinMaxState<long,double>const*>((Vector *)0x1bc8572);
  source_00 = (ArgMinMaxState<long,_double> *)
              FlatVector::GetData<duckdb::ArgMinMaxState<long,double>*>((Vector *)0x1bc8581);
  for (target_00 = (ArgMinMaxState<long,_double> *)0x0; target_00 < in_RCX;
      target_00 = (ArgMinMaxState<long,_double> *)&(target_00->super_ArgMinMaxStateBase).arg_null) {
    ArgMinMaxBase<duckdb::GreaterThan,true>::
    Combine<duckdb::ArgMinMaxState<long,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
              (source_00,target_00,(AggregateInputData *)0x1bc85bd);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}